

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eLut.cpp
# Opt level: O1

int main(void)

{
  ushort uVar1;
  ostream *poVar2;
  int i;
  long lVar3;
  ushort uVar4;
  int i_1;
  unsigned_short eLut [512];
  ushort local_428 [256];
  ushort auStack_228 [256];
  
  uVar1 = 0x4000;
  lVar3 = 0;
  do {
    if ((int)lVar3 - 0x8eU < 0xffffffe3) {
      local_428[lVar3] = 0;
      uVar4 = 0;
    }
    else {
      local_428[lVar3] = uVar1;
      uVar4 = uVar1 | 0x8000;
    }
    auStack_228[lVar3] = uVar4;
    lVar3 = lVar3 + 1;
    uVar1 = uVar1 + 0x400;
  } while (lVar3 != 0x100);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "//\n// This is an automatically generated file.\n// Do not edit.\n//\n\n",0x43);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"{\n    ",6);
  lVar3 = 0;
  do {
    *(undefined8 *)(_ITM_deregisterTMCloneTable + *(long *)(std::cout + -0x18)) = 5;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
    if ((~(uint)lVar3 & 7) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      if (lVar3 != 0x1ff) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    ",4);
      }
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x200);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"};\n",3);
  return 0;
}

Assistant:

int
main ()
{
    const int tableSize = 1 << 9;
    unsigned short eLut[tableSize];
    initELut (eLut);

    cout << "//\n"
	    "// This is an automatically generated file.\n"
	    "// Do not edit.\n"
	    "//\n\n";

    cout << "{\n    ";

    for (int i = 0; i < tableSize; i++)
    {
	cout << setw (5) << eLut[i] << ", ";

	if (i % 8 == 7)
	{
	    cout << "\n";

	    if (i < tableSize - 1)
		cout << "    ";
	}
    }

    cout << "};\n";
    return 0;
}